

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int vcf_format(bcf_hdr_t *h,bcf1_t *v,kstring_t *s)

{
  bcf_fmt_t *pbVar1;
  bool bVar2;
  int iVar3;
  bcf_info_t *pbVar4;
  bcf_fmt_t *fmt_00;
  char *local_60;
  bcf_fmt_t *f;
  int first_1;
  bcf_fmt_t *fmt;
  int local_38;
  int gt_i;
  int j;
  int i_1;
  bcf_info_t *z;
  int first;
  int i;
  kstring_t *s_local;
  bcf1_t *v_local;
  bcf_hdr_t *h_local;
  
  bcf_unpack(v,0xf);
  kputs(h->id[1][v->rid].key,s);
  kputc(9,s);
  kputw(v->pos + 1,s);
  kputc(9,s);
  if ((v->d).id == (char *)0x0) {
    local_60 = ".";
  }
  else {
    local_60 = (v->d).id;
  }
  kputs(local_60,s);
  kputc(9,s);
  if ((*(ulong *)&v->field_0x10 >> 0x10 & 0xffff) == 0) {
    kputc(0x2e,s);
  }
  else {
    kputs(*(v->d).allele,s);
  }
  kputc(9,s);
  if (((uint)(*(ulong *)&v->field_0x10 >> 0x10) & 0xffff) == 1 ||
      (*(ulong *)&v->field_0x10 & 0xffff0000) == 0) {
    kputc(0x2e,s);
  }
  else {
    for (z._4_4_ = 1; z._4_4_ < (int)((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x10) & 0xffff)
        ; z._4_4_ = z._4_4_ + 1) {
      if (1 < z._4_4_) {
        kputc(0x2c,s);
      }
      kputs((v->d).allele[z._4_4_],s);
    }
  }
  kputc(9,s);
  iVar3 = bcf_float_is_missing(v->qual);
  if (iVar3 == 0) {
    ksprintf(s,"%g",(double)v->qual);
  }
  else {
    kputc(0x2e,s);
  }
  kputc(9,s);
  if ((v->d).n_flt == 0) {
    kputc(0x2e,s);
  }
  else {
    for (z._4_4_ = 0; z._4_4_ < (v->d).n_flt; z._4_4_ = z._4_4_ + 1) {
      if (z._4_4_ != 0) {
        kputc(0x3b,s);
      }
      kputs(h->id[0][(v->d).flt[z._4_4_]].key,s);
    }
  }
  kputc(9,s);
  if ((*(ulong *)&v->field_0x10 & 0xffff) == 0) {
    kputc(0x2e,s);
  }
  else {
    bVar2 = true;
    for (z._4_4_ = 0; z._4_4_ < (int)((uint)*(undefined8 *)&v->field_0x10 & 0xffff);
        z._4_4_ = z._4_4_ + 1) {
      pbVar4 = (v->d).info + z._4_4_;
      if (pbVar4->vptr != (uint8_t *)0x0) {
        if (!bVar2) {
          kputc(0x3b,s);
        }
        bVar2 = false;
        kputs(h->id[0][pbVar4->key].key,s);
        if (0 < pbVar4->len) {
          kputc(0x3d,s);
          if (pbVar4->len == 1) {
            switch(pbVar4->type) {
            case 1:
              if ((pbVar4->v1).i == -0x80) {
                kputc(0x2e,s);
              }
              else {
                kputw((pbVar4->v1).i,s);
              }
              break;
            case 2:
              if ((pbVar4->v1).i == -0x8000) {
                kputc(0x2e,s);
              }
              else {
                kputw((pbVar4->v1).i,s);
              }
              break;
            case 3:
              if ((pbVar4->v1).i == -0x80000000) {
                kputc(0x2e,s);
              }
              else {
                kputw((pbVar4->v1).i,s);
              }
              break;
            default:
              fprintf(_stderr,"todo: type %d\n",(ulong)(uint)pbVar4->type);
              exit(1);
            case 5:
              iVar3 = bcf_float_is_missing((pbVar4->v1).f);
              if (iVar3 == 0) {
                ksprintf(s,"%g",(double)(pbVar4->v1).f);
              }
              else {
                kputc(0x2e,s);
              }
              break;
            case 7:
              kputc((pbVar4->v1).i,s);
            }
          }
          else {
            bcf_fmt_array(s,pbVar4->len,pbVar4->type,pbVar4->vptr);
          }
        }
      }
    }
    if (bVar2) {
      kputc(0x2e,s);
    }
  }
  if ((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28) != 0) {
    if ((*(ulong *)&v->field_0x10 >> 0x20 & 0xff) == 0) {
      for (local_38 = 0; local_38 <= (int)(uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28);
          local_38 = local_38 + 1) {
        kputs("\t.",s);
      }
    }
    else {
      fmt._4_4_ = -1;
      pbVar1 = (v->d).fmt;
      bVar2 = true;
      for (gt_i = 0; gt_i < (int)((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x20) & 0xff);
          gt_i = gt_i + 1) {
        if (pbVar1[gt_i].p != (uint8_t *)0x0) {
          iVar3 = 9;
          if (!bVar2) {
            iVar3 = 0x3a;
          }
          kputc(iVar3,s);
          bVar2 = false;
          if (pbVar1[gt_i].id < 0) {
            fprintf(_stderr,"[E::%s] invalid BCF, the FORMAT tag id=%d not present in the header.\n"
                    ,"vcf_format",(ulong)(uint)pbVar1[gt_i].id);
            abort();
          }
          kputs(h->id[0][pbVar1[gt_i].id].key,s);
          iVar3 = strcmp(h->id[0][pbVar1[gt_i].id].key,"GT");
          if (iVar3 == 0) {
            fmt._4_4_ = gt_i;
          }
        }
      }
      if (bVar2) {
        kputs("\t.",s);
      }
      for (local_38 = 0; local_38 < (int)(uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28);
          local_38 = local_38 + 1) {
        kputc(9,s);
        bVar2 = true;
        for (gt_i = 0; gt_i < (int)((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x20) & 0xff);
            gt_i = gt_i + 1) {
          fmt_00 = pbVar1 + gt_i;
          if (fmt_00->p != (uint8_t *)0x0) {
            if (!bVar2) {
              kputc(0x3a,s);
            }
            bVar2 = false;
            if (fmt._4_4_ == gt_i) {
              bcf_format_gt(fmt_00,local_38,s);
            }
            else {
              bcf_fmt_array(s,fmt_00->n,fmt_00->type,fmt_00->p + local_38 * fmt_00->size);
            }
          }
        }
        if (bVar2) {
          kputc(0x2e,s);
        }
      }
    }
  }
  kputc(10,s);
  return 0;
}

Assistant:

int vcf_format(const bcf_hdr_t *h, const bcf1_t *v, kstring_t *s)
{
    int i;
    bcf_unpack((bcf1_t*)v, BCF_UN_ALL);
    kputs(h->id[BCF_DT_CTG][v->rid].key, s); // CHROM
    kputc('\t', s); kputw(v->pos + 1, s); // POS
    kputc('\t', s); kputs(v->d.id ? v->d.id : ".", s); // ID
    kputc('\t', s); // REF
    if (v->n_allele > 0) kputs(v->d.allele[0], s);
    else kputc('.', s);
    kputc('\t', s); // ALT
    if (v->n_allele > 1) {
        for (i = 1; i < v->n_allele; ++i) {
            if (i > 1) kputc(',', s);
            kputs(v->d.allele[i], s);
        }
    } else kputc('.', s);
    kputc('\t', s); // QUAL
    if ( bcf_float_is_missing(v->qual) ) kputc('.', s); // QUAL
    else ksprintf(s, "%g", v->qual);
    kputc('\t', s); // FILTER
    if (v->d.n_flt) {
        for (i = 0; i < v->d.n_flt; ++i) {
            if (i) kputc(';', s);
            kputs(h->id[BCF_DT_ID][v->d.flt[i]].key, s);
        }
    } else kputc('.', s);
    kputc('\t', s); // INFO
    if (v->n_info) {
        int first = 1;
        for (i = 0; i < v->n_info; ++i) {
            bcf_info_t *z = &v->d.info[i];
            if ( !z->vptr ) continue;
            if ( !first ) kputc(';', s); first = 0;
            kputs(h->id[BCF_DT_ID][z->key].key, s);
            if (z->len <= 0) continue;
            kputc('=', s);
            if (z->len == 1) 
            {
                switch (z->type) 
                {
                    case BCF_BT_INT8:  if ( z->v1.i==bcf_int8_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT16: if ( z->v1.i==bcf_int16_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT32: if ( z->v1.i==bcf_int32_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_FLOAT: if ( bcf_float_is_missing(z->v1.f) ) kputc('.', s); else ksprintf(s, "%g", z->v1.f); break;
                    case BCF_BT_CHAR:  kputc(z->v1.i, s); break;
                    default: fprintf(stderr,"todo: type %d\n", z->type); exit(1); break;
                }
            }
            else bcf_fmt_array(s, z->len, z->type, z->vptr);
        }
        if ( first ) kputc('.', s);
    } else kputc('.', s);
    // FORMAT and individual information
    if (v->n_sample)
    {
        int i,j;
        if ( v->n_fmt)
        {
            int gt_i = -1;
            bcf_fmt_t *fmt = v->d.fmt;
            int first = 1;
            for (i = 0; i < (int)v->n_fmt; ++i) {
                if ( !fmt[i].p ) continue;
                kputc(!first ? ':' : '\t', s); first = 0;
                if ( fmt[i].id<0 ) //!bcf_hdr_idinfo_exists(h,BCF_HL_FMT,fmt[i].id) )
                {
                    fprintf(stderr, "[E::%s] invalid BCF, the FORMAT tag id=%d not present in the header.\n", __func__, fmt[i].id);
                    abort();
                }
                kputs(h->id[BCF_DT_ID][fmt[i].id].key, s);
                if (strcmp(h->id[BCF_DT_ID][fmt[i].id].key, "GT") == 0) gt_i = i;
            }
            if ( first ) kputs("\t.", s);
            for (j = 0; j < v->n_sample; ++j) {
                kputc('\t', s);
                first = 1;
                for (i = 0; i < (int)v->n_fmt; ++i) {
                    bcf_fmt_t *f = &fmt[i];
                    if ( !f->p ) continue;
                    if (!first) kputc(':', s); first = 0;
                    if (gt_i == i)
                        bcf_format_gt(f,j,s);
                    else
                        bcf_fmt_array(s, f->n, f->type, f->p + j * f->size);
                }
                if ( first ) kputc('.', s);
            }
        }
        else
            for (j=0; j<=v->n_sample; j++)
                kputs("\t.", s);
    }
    kputc('\n', s);
    return 0;
}